

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

ostream * nonius::operator<<(ostream *os,parameters *m)

{
  ostream *poVar1;
  __node_base *p_Var2;
  
  p_Var2 = &(m->
            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
            )._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    poVar1 = std::operator<<(os,"  ");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = (ostream *)(*(code *)(p_Var2[5]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var2[5]._M_nxt,poVar1);
    std::operator<<(poVar1,"\n");
  }
  return os;
}

Assistant:

std::ostream& operator<< (std::ostream& os, const parameters& m) {
        for(auto&& p : m) os << "  " << p.first << " = " << p.second << "\n";
        return os;
    }